

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  uhugeint_t input;
  uhugeint_t input_00;
  uhugeint_t input_01;
  uhugeint_t input_02;
  uhugeint_t input_03;
  bool bVar1;
  StandardWriterPageState<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator> *pSVar2;
  ValidityMask *this_00;
  BssEncoder *this_01;
  ClientContext *pCVar3;
  InternalException *this_02;
  ColumnWriterStatistics *in_RDX;
  Allocator *in_RDI;
  ulong in_R9;
  double dVar4;
  ulong in_stack_00000008;
  double target_value_4;
  idx_t r_3;
  double target_value_3;
  double target_value_2;
  idx_t r_2;
  double target_value_1;
  double target_value;
  idx_t r_1;
  uint32_t value_index;
  uhugeint_t *src_value;
  idx_t r;
  uhugeint_t *data_ptr;
  ValidityMask *mask;
  StandardWriterPageState<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator> *page_state;
  WriteStream *in_stack_00003ee8;
  ValidityMask *in_stack_00003ef0;
  idx_t in_stack_00003ef8;
  idx_t in_stack_00003f00;
  ColumnWriterStatistics *in_stack_00003f08;
  Vector *in_stack_00003f10;
  uhugeint_t *in_stack_fffffffffffffea8;
  PrimitiveDictionary<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator>
  *in_stack_fffffffffffffeb0;
  allocator *paVar5;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffeb8;
  RleBpEncoder *in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffee8;
  WriteStream *in_stack_fffffffffffffef0;
  WriteStream *in_stack_fffffffffffffef8;
  DlbaEncoder *in_stack_ffffffffffffff00;
  ulong local_d8;
  ulong local_a0;
  ulong local_68;
  ulong local_50;
  
  pSVar2 = ColumnWriterPageState::
           Cast<duckdb::StandardWriterPageState<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator>>
                     ((ColumnWriterPageState *)in_stack_fffffffffffffeb0);
  this_00 = FlatVector::Validity((Vector *)0x5df35e);
  FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x5df373);
  this_01 = (BssEncoder *)(ulong)pSVar2->encoding;
  switch(this_01) {
  case (BssEncoder *)0x0:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                      ((TemplatedValidityMask<unsigned_long> *)this_00);
    if (bVar1) {
      TemplatedWritePlain<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator,true>
                (in_stack_00003f10,in_stack_00003f08,in_stack_00003f00,in_stack_00003ef8,
                 in_stack_00003ef0,in_stack_00003ee8);
    }
    else {
      TemplatedWritePlain<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator,false>
                (in_stack_00003f10,in_stack_00003f08,in_stack_00003f00,in_stack_00003ef8,
                 in_stack_00003ef0,in_stack_00003ee8);
    }
    break;
  default:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    paVar5 = (allocator *)&stack0xfffffffffffffeef;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffef0,"Unknown encoding",paVar5);
    duckdb::InternalException::InternalException(this_02,(string *)&stack0xfffffffffffffef0);
    __cxa_throw(this_02,&InternalException::typeinfo,InternalException::~InternalException);
  case (BssEncoder *)0x5:
    local_68 = in_R9;
    if ((pSVar2->dbp_initialized & 1U) == 0) {
      for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffeb8,(idx_t)in_stack_fffffffffffffeb0);
        if (bVar1) {
          input.upper = (uint64_t)in_stack_fffffffffffffec0;
          input.lower = (uint64_t)in_stack_fffffffffffffeb8;
          dVar4 = ParquetUhugeintOperator::Operation<duckdb::uhugeint_t,double>(input);
          ParquetUhugeintOperator::HandleStats<duckdb::uhugeint_t,double>(in_RDX,dVar4);
          DbpEncoder::BeginWrite<double>
                    (&in_stack_ffffffffffffff00->dbp_encoder,in_stack_fffffffffffffef8,
                     (double *)in_stack_fffffffffffffef0);
          pSVar2->dbp_initialized = true;
          local_68 = local_68 + 1;
          break;
        }
      }
    }
    for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
      input_00.upper = (uint64_t)in_stack_fffffffffffffec0;
      input_00.lower = (uint64_t)in_stack_fffffffffffffeb8;
      dVar4 = ParquetUhugeintOperator::Operation<duckdb::uhugeint_t,double>(input_00);
      ParquetUhugeintOperator::HandleStats<duckdb::uhugeint_t,double>(in_RDX,dVar4);
      DbpEncoder::WriteValue<double>
                (&in_stack_ffffffffffffff00->dbp_encoder,in_stack_fffffffffffffef8,
                 (double *)in_stack_fffffffffffffef0);
    }
    break;
  case (BssEncoder *)0x6:
    local_a0 = in_R9;
    if ((pSVar2->dlba_initialized & 1U) == 0) {
      for (; local_a0 < in_stack_00000008; local_a0 = local_a0 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffeb8,(idx_t)in_stack_fffffffffffffeb0);
        if (bVar1) {
          input_01.upper = (uint64_t)in_stack_fffffffffffffec0;
          input_01.lower = (uint64_t)in_stack_fffffffffffffeb8;
          dVar4 = ParquetUhugeintOperator::Operation<duckdb::uhugeint_t,double>(input_01);
          ParquetUhugeintOperator::HandleStats<duckdb::uhugeint_t,double>(in_RDX,dVar4);
          in_stack_fffffffffffffec0 = (RleBpEncoder *)&pSVar2->dlba_encoder;
          pCVar3 = ParquetWriter::GetContext(*(ParquetWriter **)(in_RDI + 8));
          duckdb::BufferAllocator::Get(pCVar3);
          DlbaEncoder::BeginWrite<double>
                    (in_stack_ffffffffffffff00,(Allocator *)in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          pSVar2->dlba_initialized = true;
          local_a0 = local_a0 + 1;
          break;
        }
      }
    }
    for (; local_a0 < in_stack_00000008; local_a0 = local_a0 + 1) {
      input_02.upper = (uint64_t)in_stack_fffffffffffffec0;
      input_02.lower = (uint64_t)in_stack_fffffffffffffeb8;
      dVar4 = ParquetUhugeintOperator::Operation<duckdb::uhugeint_t,double>(input_02);
      ParquetUhugeintOperator::HandleStats<duckdb::uhugeint_t,double>(in_RDX,dVar4);
      DlbaEncoder::WriteValue<double>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (double *)in_stack_fffffffffffffef0);
    }
    break;
  case (BssEncoder *)0x8:
    local_50 = in_R9;
    if ((pSVar2->dict_written_value & 1U) == 0) {
      for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffeb8,(idx_t)in_stack_fffffffffffffeb0);
        if (bVar1) {
          WriteStream::Write<unsigned_char>
                    ((WriteStream *)in_stack_fffffffffffffeb0,
                     (uchar)((ulong)in_stack_fffffffffffffea8 >> 0x38));
          RleBpEncoder::BeginWrite(&pSVar2->dict_encoder);
          pSVar2->dict_written_value = true;
          break;
        }
      }
    }
    for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
      PrimitiveDictionary<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator>::GetIndex
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      RleBpEncoder::WriteValue
                (in_stack_fffffffffffffec0,(WriteStream *)in_stack_fffffffffffffeb8,
                 (uint32_t *)in_stack_fffffffffffffeb0);
    }
    break;
  case (BssEncoder *)0x9:
    local_d8 = in_R9;
    if ((pSVar2->bss_initialized & 1U) != 0) {
      in_stack_fffffffffffffeb8 = (TemplatedValidityMask<unsigned_long> *)&pSVar2->bss_encoder;
      pCVar3 = ParquetWriter::GetContext(*(ParquetWriter **)(in_RDI + 8));
      duckdb::BufferAllocator::Get(pCVar3);
      BssEncoder::BeginWrite(this_01,in_RDI);
      pSVar2->bss_initialized = true;
    }
    for (; local_d8 < in_stack_00000008; local_d8 = local_d8 + 1) {
      input_03.upper = (uint64_t)in_stack_fffffffffffffec0;
      input_03.lower = (uint64_t)in_stack_fffffffffffffeb8;
      dVar4 = ParquetUhugeintOperator::Operation<duckdb::uhugeint_t,double>(input_03);
      ParquetUhugeintOperator::HandleStats<duckdb::uhugeint_t,double>(in_RDX,dVar4);
      BssEncoder::WriteValue<double>
                ((BssEncoder *)in_stack_fffffffffffffec0,(double *)in_stack_fffffffffffffeb8);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}